

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O2

void validate(pfx_table *pfxt,uint32_t asn,char *prefix,uint8_t prefix_len,
             pfxv_state expected_result)

{
  long lVar1;
  uint __line;
  int iVar2;
  char *__assertion;
  long in_FS_OFFSET;
  pfxv_state val_res;
  lrtr_ip_addr ip;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = lrtr_ip_str_to_addr(prefix,&ip);
  if (iVar2 == 0) {
    iVar2 = pfx_table_validate(pfxt,asn,&ip,prefix_len,&val_res);
    if (iVar2 == 0) {
      if (val_res == expected_result) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        __stack_chk_fail();
      }
      __assertion = "val_res == expected_result";
      __line = 0x23;
    }
    else {
      __assertion = "pfx_table_validate(pfxt, asn, &ip, prefix_len, &val_res) == PFX_SUCCESS";
      __line = 0x21;
    }
  }
  else {
    __assertion = "!lrtr_ip_str_to_addr(prefix, &ip)";
    __line = 0x1f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                ,__line,
                "void validate(struct pfx_table *, uint32_t, const char *, uint8_t, enum pfxv_state)"
               );
}

Assistant:

static void validate(struct pfx_table *pfxt, uint32_t asn, const char *prefix, uint8_t prefix_len,
		     enum pfxv_state expected_result)
{
	struct lrtr_ip_addr ip;
	enum pfxv_state val_res;

	assert(!lrtr_ip_str_to_addr(prefix, &ip));

	assert(pfx_table_validate(pfxt, asn, &ip, prefix_len, &val_res) == PFX_SUCCESS);

	assert(val_res == expected_result);
}